

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TiledOutputFile::writeTiles
          (TiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  _Rb_tree_header *__x;
  size_t *psVar1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  TileBuffer *pTVar5;
  OutputStreamMutex *streamData;
  char *pixelData;
  _Base_ptr p_Var6;
  int dx;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  TileBufferTask *pTVar12;
  uint64_t *puVar13;
  iterator iVar14;
  iterator iVar15;
  void *pvVar16;
  _Base_ptr p_Var17;
  iterator iVar18;
  _Rb_tree_node_base *p_Var19;
  iterator iVar20;
  ostream *poVar21;
  ArgExc *pAVar22;
  IoExc *this_00;
  int iVar23;
  int iVar24;
  ulong uVar25;
  TileCoord *pTVar26;
  _Base_ptr *pp_Var27;
  long lVar28;
  TileCoord *__y;
  TileCoord *__y_00;
  TileCoord *__y_01;
  TileCoord *extraout_RDX;
  TileCoord *extraout_RDX_00;
  TileCoord *extraout_RDX_01;
  TileCoord *extraout_RDX_02;
  TileCoord *extraout_RDX_03;
  TileCoord *extraout_RDX_04;
  uint number;
  _Base_ptr p_Var29;
  string *psVar30;
  uint uVar31;
  uint number_00;
  string *psVar32;
  ulong uVar33;
  long lVar34;
  _Rb_tree_node_base *__x_00;
  iterator iVar35;
  TileCoord TVar36;
  undefined1 auVar37 [16];
  int local_3d0;
  int local_3bc;
  TileCoord currentTile;
  stringstream _iex_throw_s;
  ostream local_330 [376];
  TaskGroup taskGroup;
  
  __mutex = (pthread_mutex_t *)this->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar22,"No frame buffer specified as pixel data source.");
  }
  else {
    bVar7 = isValidTile(this,dx1,dy1,lx,ly);
    if ((bVar7) && (bVar7 = isValidTile(this,dx2,dy2,lx,ly), bVar7)) {
      bVar7 = isValidLevel(this,lx,ly);
      if (!bVar7) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar21 = std::operator<<(local_330,"Level coordinate (");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,lx);
        poVar21 = std::operator<<(poVar21,", ");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,ly);
        std::operator<<(poVar21,") is invalid.");
        pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar22,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar22,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      iVar8 = dx2;
      if (dx2 < dx1) {
        iVar8 = dx1;
      }
      lVar11 = (long)dx2;
      if (dx1 < dx2) {
        dx2 = dx1;
      }
      iVar9 = dy2;
      if (dy2 < dy1) {
        iVar9 = dy1;
      }
      lVar28 = (long)dy2;
      if (dy1 < dy2) {
        dy2 = dy1;
      }
      bVar7 = pDVar2->lineOrder != DECREASING_Y;
      local_3d0 = dy2;
      if (!bVar7) {
        local_3d0 = iVar9;
      }
      lVar11 = dx1 - lVar11;
      lVar34 = -lVar11;
      if (0 < lVar11) {
        lVar34 = lVar11;
      }
      lVar28 = dy1 - lVar28;
      lVar11 = -lVar28;
      if (0 < lVar28) {
        lVar11 = lVar28;
      }
      ppTVar3 = (pDVar2->tileBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppTVar4 = (pDVar2->tileBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      IlmThread_3_4::TaskGroup::TaskGroup(&taskGroup);
      iVar9 = (uint)bVar7 * 2 + -1;
      uVar31 = ((int)lVar11 + 1) * ((int)lVar34 + 1);
      number = (uint)((ulong)((long)ppTVar3 - (long)ppTVar4) >> 3);
      if ((int)uVar31 < (int)number) {
        number = uVar31;
      }
      if ((int)number < 1) {
        number = 0;
      }
      local_3bc = local_3d0;
      dx = dx2;
      for (number_00 = 0; number != number_00; number_00 = number_00 + 1) {
        pTVar12 = (TileBufferTask *)operator_new(0x20);
        anon_unknown_6::TileBufferTask::TileBufferTask
                  (pTVar12,&taskGroup,this->_data,number_00,dx,local_3bc,lx,ly);
        IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pTVar12);
        iVar10 = dx + 1;
        bVar7 = dx < iVar8;
        iVar23 = iVar9;
        dx = dx2;
        if (bVar7) {
          iVar23 = 0;
          dx = iVar10;
        }
        local_3bc = local_3bc + iVar23;
      }
      uVar25 = 0;
      if (0 < (int)uVar31) {
        uVar25 = (ulong)uVar31;
      }
      uVar33 = 0;
      iVar23 = dx2;
      do {
        if (uVar33 == uVar25) {
          IlmThread_3_4::TaskGroup::~TaskGroup(&taskGroup);
          ppTVar3 = (this->_data->tileBuffers).
                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppTVar4 = (this->_data->tileBuffers).
                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar30 = (string *)0x0;
          for (lVar11 = 0; (long)ppTVar4 - (long)ppTVar3 >> 3 != lVar11; lVar11 = lVar11 + 1) {
            pTVar5 = ppTVar3[lVar11];
            psVar32 = (string *)&pTVar5->sampleCountTablePtr;
            if (psVar30 != (string *)0x0) {
              psVar32 = psVar30;
            }
            if (*(char *)&(pTVar5->sampleCountTableBuffer)._data != '\0') {
              psVar30 = psVar32;
            }
            *(undefined1 *)&(pTVar5->sampleCountTableBuffer)._data = 0;
          }
          if (psVar30 != (string *)0x0) {
            this_00 = (IoExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::IoExc::IoExc(this_00,psVar30);
            __cxa_throw(this_00,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
          }
          pthread_mutex_unlock(__mutex);
          return;
        }
        ppTVar3 = (this->_data->tileBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar5 = ppTVar3[uVar33 % (ulong)((long)(this->_data->tileBuffers).
                                                super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppTVar3 >> 3)];
        IlmThread_3_4::Semaphore::wait();
        pDVar2 = this->_data;
        streamData = this->_streamData;
        pixelData = pTVar5->dataPtr;
        iVar10 = (int)pTVar5->dataSize;
        puVar13 = TileOffsets::operator()(&pDVar2->tileOffsets,iVar23,local_3d0,lx,ly);
        if (*puVar13 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          poVar21 = std::operator<<(local_330,"Attempt to write tile (");
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,iVar23);
          poVar21 = std::operator<<(poVar21,", ");
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,local_3d0);
          poVar21 = std::operator<<(poVar21,", ");
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,lx);
          poVar21 = std::operator<<(poVar21,", ");
          poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,ly);
          std::operator<<(poVar21,") more than once.");
          pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar22,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar22,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        if (pDVar2->lineOrder == RANDOM_Y) {
          anon_unknown_6::writeTileData(streamData,pDVar2,iVar23,local_3d0,lx,ly,pixelData,iVar10);
        }
        else {
          currentTile.dy = local_3d0;
          currentTile.ly = ly;
          currentTile.dx = iVar23;
          currentTile.lx = lx;
          iVar14 = std::
                   map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                   ::find(&pDVar2->tileMap,&currentTile);
          __x = &(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar14._M_node != __x) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            poVar21 = std::operator<<(local_330,"Attempt to write tile (");
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,iVar23);
            poVar21 = std::operator<<(poVar21,", ");
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,local_3d0);
            poVar21 = std::operator<<(poVar21,", ");
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,lx);
            poVar21 = std::operator<<(poVar21,", ");
            poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,ly);
            std::operator<<(poVar21,") more than once.");
            pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(pAVar22,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar22,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
          }
          if (((((pDVar2->nextTileToWrite).lx == lx) && ((pDVar2->nextTileToWrite).ly == ly)) &&
              (pTVar26 = &pDVar2->nextTileToWrite, pTVar26->dx == iVar23)) &&
             ((pDVar2->nextTileToWrite).dy == local_3d0)) {
            anon_unknown_6::writeTileData(streamData,pDVar2,iVar23,local_3d0,lx,ly,pixelData,iVar10)
            ;
            TVar36 = Data::nextTileCoord(pDVar2,pTVar26);
            while( true ) {
              pDVar2->nextTileToWrite = TVar36;
              iVar15 = std::
                       map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                       ::find(&pDVar2->tileMap,pTVar26);
              if (iVar15._M_node == iVar14._M_node) break;
              anon_unknown_6::writeTileData
                        (streamData,pDVar2,iVar15._M_node[1]._M_color,
                         *(int *)&iVar15._M_node[1].field_0x4,*(int *)&iVar15._M_node[1]._M_parent,
                         *(int *)((long)&iVar15._M_node[1]._M_parent + 4),
                         *(char **)iVar15._M_node[1]._M_left,
                         *(int *)&(iVar15._M_node[1]._M_left)->_M_parent);
              p_Var17 = iVar15._M_node[1]._M_left;
              if (p_Var17 != (_Base_ptr)0x0) {
                anon_unknown_6::BufferedTile::~BufferedTile((BufferedTile *)p_Var17);
              }
              operator_delete(p_Var17,0x10);
              pvVar16 = (void *)std::_Rb_tree_rebalance_for_erase(iVar15._M_node,&__x->_M_header);
              operator_delete(pvVar16,0x38);
              psVar1 = &(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
              *psVar1 = *psVar1 - 1;
              TVar36 = Data::nextTileCoord(pDVar2,pTVar26);
            }
          }
          else {
            pTVar26 = (TileCoord *)__x;
            p_Var17 = (_Base_ptr)operator_new(0x10);
            *(undefined8 *)p_Var17 = 0;
            *(int *)&p_Var17->_M_parent = iVar10;
            pvVar16 = operator_new__((long)iVar10);
            *(void **)p_Var17 = pvVar16;
            memcpy(pvVar16,pixelData,(long)iVar10);
            iVar18 = std::
                     _Rb_tree<Imf_3_4::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                     ::_M_lower_bound((_Rb_tree<Imf_3_4::(anonymous_namespace)::TileCoord,_std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>,_std::_Select1st<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                                       *)(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header.
                                         _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&currentTile
                                      ,pTVar26);
            if ((iVar18._M_node == iVar14._M_node) ||
               (bVar7 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                  ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)&currentTile,
                                   (TileCoord *)(iVar18._M_node + 1),__y), bVar7)) {
              p_Var19 = (_Rb_tree_node_base *)operator_new(0x38);
              p_Var19[1]._M_left = (_Base_ptr)0x0;
              __x_00 = p_Var19 + 1;
              *(ulong *)(p_Var19 + 1) = CONCAT44(currentTile.dy,currentTile.dx);
              p_Var19[1]._M_parent = (_Base_ptr)CONCAT44(currentTile.ly,currentTile.lx);
              if (iVar18._M_node == iVar14._M_node) {
                pTVar26 = __y_00;
                if ((pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                  iVar20._M_node =
                       (pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                  bVar7 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                     (iVar20._M_node + 1),(TileCoord *)__x_00,__y_00);
                  pTVar26 = extraout_RDX_00;
                  if (bVar7) {
                    p_Var29 = (_Base_ptr)0x0;
                    goto LAB_001a1b01;
                  }
                }
LAB_001a1a97:
                pp_Var27 = &(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                ;
                bVar7 = true;
                iVar35._M_node = &__x->_M_header;
                while( true ) {
                  auVar37._8_8_ = pTVar26;
                  auVar37._0_8_ = iVar35._M_node;
                  p_Var29 = *pp_Var27;
                  if (p_Var29 == (_Base_ptr)0x0) break;
                  bVar7 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x_00,
                                     (TileCoord *)(p_Var29 + 1),pTVar26);
                  pp_Var27 = &p_Var29->_M_left + !bVar7;
                  pTVar26 = extraout_RDX_03;
                  iVar35._M_node = p_Var29;
                }
                if (bVar7 == false) {
LAB_001a1aeb:
                  iVar18._M_node = auVar37._0_8_;
                  bVar7 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                     (iVar18._M_node + 1),(TileCoord *)__x_00,auVar37._8_8_);
                  pTVar26 = extraout_RDX_04;
                  if (!bVar7) goto LAB_001a1b49;
                }
                else if (iVar35._M_node !=
                         (pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
                  auVar37 = std::_Rb_tree_decrement(iVar35._M_node);
                  goto LAB_001a1aeb;
                }
LAB_001a1afb:
                p_Var29 = (_Base_ptr)0x0;
                iVar20._M_node = iVar35._M_node;
              }
              else {
                bVar7 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                  ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x_00,
                                   (TileCoord *)(iVar18._M_node + 1),__y_00);
                if (bVar7) {
                  iVar20._M_node =
                       (pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  pTVar26 = __y_01;
                  p_Var29 = iVar20._M_node;
                  if (iVar20._M_node != iVar18._M_node) {
                    auVar37 = std::_Rb_tree_decrement(iVar18._M_node);
                    iVar35._M_node = auVar37._0_8_;
                    bVar7 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                       (iVar35._M_node + 1),(TileCoord *)__x_00,auVar37._8_8_);
                    pTVar26 = extraout_RDX;
                    if (!bVar7) goto LAB_001a1a97;
                    p_Var6 = (iVar35._M_node)->_M_right;
                    iVar20 = iVar18;
joined_r0x001a1a90:
                    p_Var29 = iVar20._M_node;
                    if (p_Var6 == (_Base_ptr)0x0) goto LAB_001a1afb;
                  }
                }
                else {
                  bVar7 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                     (iVar18._M_node + 1),(TileCoord *)__x_00,__y_01);
                  if (!bVar7) goto LAB_001a1b49;
                  iVar20._M_node =
                       (pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                  if (iVar20._M_node != iVar18._M_node) {
                    auVar37 = std::_Rb_tree_increment(iVar18._M_node);
                    bVar7 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x_00,
                                       (TileCoord *)(auVar37._0_8_ + 1),auVar37._8_8_);
                    pTVar26 = extraout_RDX_02;
                    if (!bVar7) goto LAB_001a1a97;
                    p_Var6 = (iVar18._M_node)->_M_right;
                    iVar35 = iVar18;
                    iVar20._M_node = auVar37._0_8_;
                    goto joined_r0x001a1a90;
                  }
                  p_Var29 = (_Base_ptr)0x0;
                  pTVar26 = extraout_RDX_01;
                }
LAB_001a1b01:
                iVar18._M_node = p_Var29;
                if (iVar20._M_node == (_Base_ptr)0x0) {
LAB_001a1b49:
                  operator_delete(p_Var19,0x38);
                  goto LAB_001a1b5c;
                }
              }
              bVar7 = true;
              if (iVar14._M_node != iVar20._M_node && p_Var29 == (_Base_ptr)0x0) {
                bVar7 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                  ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x_00,
                                   (TileCoord *)(iVar20._M_node + 1),pTVar26);
              }
              std::_Rb_tree_insert_and_rebalance(bVar7,p_Var19,iVar20._M_node,&__x->_M_header);
              psVar1 = &(pDVar2->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
              *psVar1 = *psVar1 + 1;
              iVar18._M_node = p_Var19;
            }
LAB_001a1b5c:
            iVar18._M_node[1]._M_left = p_Var17;
          }
        }
        IlmThread_3_4::Semaphore::post();
        if ((int)number < (int)uVar31) {
          pTVar12 = (TileBufferTask *)operator_new(0x20);
          anon_unknown_6::TileBufferTask::TileBufferTask
                    (pTVar12,&taskGroup,this->_data,number,dx,local_3bc,lx,ly);
          IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pTVar12);
        }
        uVar33 = uVar33 + 1;
        iVar10 = iVar23 + 1;
        if (iVar8 <= iVar23) {
          iVar10 = dx2;
        }
        iVar24 = iVar9;
        if (iVar23 < iVar8) {
          iVar24 = 0;
        }
        local_3d0 = local_3d0 + iVar24;
        number = number + 1;
        iVar24 = dx + 1;
        bVar7 = dx < iVar8;
        iVar23 = iVar9;
        dx = dx2;
        if (bVar7) {
          iVar23 = 0;
          dx = iVar24;
        }
        local_3bc = local_3bc + iVar23;
        iVar23 = iVar10;
      } while( true );
    }
    pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar22,"Tile coordinates are invalid.");
  }
  __cxa_throw(pAVar22,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledOutputFile::writeTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data source.");

        if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //

        if (dx1 > dx2) swap (dx1, dx2);

        if (dy1 > dy2) swap (dy1, dy2);

        int dyStart = dy1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }

        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int) _data->tileBuffers.size (), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add in the initial compression tasks to the thread pool
            //

            int nextCompBuffer = 0;
            int dxComp         = dx1;
            int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (
                    &taskGroup,
                    _data,
                    nextCompBuffer++,
                    dxComp,
                    dyComp,
                    lx,
                    ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // Write the compressed buffers and add in more compression
            // tasks until done
            //

            int nextWriteBuffer = 0;
            int dxWrite         = dx1;
            int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
                //
                // Wait until the nextWriteBuffer is ready to be written
                //

                TileBuffer* writeBuffer =
                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                //
                // Write the tilebuffer
                //

                bufferedTileWrite (
                    _streamData,
                    _data,
                    dxWrite,
                    dyWrite,
                    lx,
                    ly,
                    writeBuffer->dataPtr,
                    writeBuffer->dataSize);

                //
                // Release the lock on nextWriteBuffer
                //

                writeBuffer->post ();

                //
                // If there are no more tileBuffers to compress, then
                // only continue to write out remaining tileBuffers,
                // otherwise keep adding compression tasks.
                //

                if (nextCompBuffer < numTiles)
                {
                    //
                    // add nextCompBuffer as a compression Task
                    //

                    ThreadPool::addGlobalTask (new TileBufferTask (
                        &taskGroup,
                        _data,
                        nextCompBuffer,
                        dxComp,
                        dyComp,
                        lx,
                        ly));
                }

                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }

                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledOutputFile::writeTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size (); ++i)
        {
            TileBuffer* tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}